

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BgzfStream::BgzfStream(BgzfStream *this)

{
  undefined4 *in_RDI;
  RaiiBuffer *this_00;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined1 *)(in_RDI + 4) = 1;
  *(undefined8 *)(in_RDI + 6) = 0;
  this_00 = (RaiiBuffer *)0x10000;
  RaiiBuffer::RaiiBuffer((RaiiBuffer *)0x10000,(size_t)in_RDI);
  RaiiBuffer::RaiiBuffer(this_00,(size_t)in_RDI);
  return;
}

Assistant:

BgzfStream::BgzfStream()
    : m_blockLength(0)
    , m_blockOffset(0)
    , m_blockAddress(0)
    , m_isWriteCompressed(true)
    , m_device(0)
    , m_uncompressedBlock(Constants::BGZF_DEFAULT_BLOCK_SIZE)
    , m_compressedBlock(Constants::BGZF_MAX_BLOCK_SIZE)
{}